

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_endomorphism_tests(void)

{
  secp256k1_scalar full;
  uint i;
  secp256k1_scalar *in_stack_00000070;
  secp256k1_scalar *in_stack_ffffffffffffffe8;
  secp256k1_scalar *in_stack_fffffffffffffff0;
  undefined4 local_4;
  
  test_scalar_split(in_stack_00000070);
  test_scalar_split(in_stack_00000070);
  secp256k1_scalar_negate(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  test_scalar_split(in_stack_00000070);
  test_scalar_split(in_stack_00000070);
  secp256k1_scalar_add
            ((secp256k1_scalar *)full.d[2],(secp256k1_scalar *)full.d[1],
             (secp256k1_scalar *)full.d[0]);
  test_scalar_split(in_stack_00000070);
  for (local_4 = 0; local_4 < (uint)(COUNT * 100); local_4 = local_4 + 1) {
    testutil_random_scalar_order_test((secp256k1_scalar *)full.d[0]);
    test_scalar_split(in_stack_00000070);
  }
  for (local_4 = 0; local_4 < 0x14; local_4 = local_4 + 1) {
    test_scalar_split(in_stack_00000070);
  }
  return;
}

Assistant:

static void run_endomorphism_tests(void) {
    unsigned i;
    static secp256k1_scalar s;
    test_scalar_split(&secp256k1_scalar_zero);
    test_scalar_split(&secp256k1_scalar_one);
    secp256k1_scalar_negate(&s,&secp256k1_scalar_one);
    test_scalar_split(&s);
    test_scalar_split(&secp256k1_const_lambda);
    secp256k1_scalar_add(&s, &secp256k1_const_lambda, &secp256k1_scalar_one);
    test_scalar_split(&s);

    for (i = 0; i < 100U * COUNT; ++i) {
        secp256k1_scalar full;
        testutil_random_scalar_order_test(&full);
        test_scalar_split(&full);
    }
    for (i = 0; i < sizeof(scalars_near_split_bounds) / sizeof(scalars_near_split_bounds[0]); ++i) {
        test_scalar_split(&scalars_near_split_bounds[i]);
    }
}